

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

bool __thiscall wabt::WastLexer::ReadLineComment(WastLexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  
  pbVar1 = (byte *)this->cursor_;
  do {
    uVar3 = 0xffffffff;
    pbVar2 = pbVar1;
    if (pbVar1 < this->buffer_end_) {
      pbVar2 = pbVar1 + 1;
      this->cursor_ = (char *)pbVar2;
      uVar3 = (uint)*pbVar1;
    }
    if (uVar3 == 0xffffffff) {
      return false;
    }
    if (uVar3 == 10) goto LAB_0018df8e;
    pbVar1 = pbVar2;
  } while (uVar3 != 0xd);
  pbVar1 = (byte *)this->cursor_;
  if ((pbVar1 < this->buffer_end_) && (*pbVar1 == 10)) {
    this->cursor_ = (char *)(pbVar1 + 1);
  }
LAB_0018df8e:
  this->line_ = this->line_ + 1;
  this->line_start_ = this->cursor_;
  return true;
}

Assistant:

bool WastLexer::ReadLineComment() {
  while (true) {
    switch (ReadChar()) {
      case kEof:
        return false;

      case '\r':
        if (PeekChar() == '\n') {
          ReadChar();
        }
        Newline();
        return true;

      case '\n':
        Newline();
        return true;
    }
  }
}